

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::LE_Detonation_PDU::SetTargetEntityIDFlag(LE_Detonation_PDU *this,KBOOL F)

{
  if ((KBOOL)((this->m_DetonationFlag1Union).m_ui8Flag & 1) != F) {
    (this->m_DetonationFlag1Union).m_ui8Flag = (this->m_DetonationFlag1Union).m_ui8Flag & 0xfe | F;
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
         ((ushort)F * 8 + (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) - 4;
  }
  return;
}

Assistant:

void LE_Detonation_PDU::SetTargetEntityIDFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_DetonationFlag1Union.m_ui8TargetId )return;

    m_DetonationFlag1Union.m_ui8TargetId = F;

    if( F )
    {
        m_ui16PDULength += LE_EntityIdentifier::LE_ENTITY_IDENTIFER_SIZE;
    }
    else
    {
        m_ui16PDULength -= LE_EntityIdentifier::LE_ENTITY_IDENTIFER_SIZE;
    }
}